

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_impl.cpp
# Opt level: O2

NumberParserImpl *
icu_63::numparse::impl::NumberParserImpl::createParserFromProperties
          (DecimalFormatProperties *properties,DecimalFormatSymbols *symbols,bool parseCurrency,
          UErrorCode *status)

{
  anon_struct_3968_13_3a90479f_for_fLocalMatchers *this;
  AffixTokenMatcherWarehouse *this_00;
  AffixMatcherWarehouse *this_01;
  PercentMatcher *this_02;
  PermilleMatcher *this_03;
  NanMatcher *this_04;
  InfinityMatcher *this_05;
  PaddingMatcher *this_06;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  CurrencyPluralInfo *cpi;
  byte bVar4;
  UBool UVar5;
  int16_t iVar6;
  int iVar7;
  NumberParserImpl *this_07;
  CombinedCurrencyMatcher *pCVar8;
  PlusSignMatcher *pPVar9;
  MinusSignMatcher *pMVar10;
  UnicodeSet *this_08;
  DecimalMatcher *pDVar11;
  ScientificMatcher *pSVar12;
  CurrencyPluralInfoAffixProvider *this_09;
  uint uVar13;
  int power;
  uint uVar14;
  Grouper local_f18;
  Scale multiplier;
  Scale local_ef0;
  CurrencyUnit local_ed8;
  CurrencyUnit currency;
  UnicodeString padString;
  PropertiesAffixPatternProvider localPAPP;
  undefined1 local_d48 [8];
  Scale local_d40 [50];
  Locale locale;
  AffixTokenMatcherSetupData affixSetupData;
  CurrencySymbols currencySymbols;
  CurrencyPluralInfoAffixProvider localCPIAP;
  size_t size;
  
  Locale::Locale(&locale,&symbols->locale);
  localPAPP.super_AffixPatternProvider._vptr_AffixPatternProvider =
       (_func_int **)&PTR__PropertiesAffixPatternProvider_003cd520;
  localPAPP.posPrefix.super_Replaceable.super_UObject._vptr_UObject =
       (UObject)&PTR__UnicodeString_003daac8;
  localPAPP.posPrefix.fUnion.fStackFields.fLengthAndFlags = 2;
  localPAPP.posSuffix.super_Replaceable.super_UObject._vptr_UObject =
       (UObject)&PTR__UnicodeString_003daac8;
  localPAPP.posSuffix.fUnion.fStackFields.fLengthAndFlags = 2;
  localPAPP.negPrefix.super_Replaceable.super_UObject._vptr_UObject =
       (UObject)&PTR__UnicodeString_003daac8;
  localPAPP.negPrefix.fUnion.fStackFields.fLengthAndFlags = 2;
  localPAPP.negSuffix.super_Replaceable.super_UObject._vptr_UObject =
       (UObject)&PTR__UnicodeString_003daac8;
  localPAPP.negSuffix.fUnion.fStackFields.fLengthAndFlags = 2;
  localPAPP.fBogus = true;
  this_09 = &localCPIAP;
  icu_63::number::impl::CurrencyPluralInfoAffixProvider::CurrencyPluralInfoAffixProvider(this_09);
  cpi = (properties->currencyPluralInfo).fPtr.super_LocalPointerBase<icu_63::CurrencyPluralInfo>.ptr
  ;
  if (cpi == (CurrencyPluralInfo *)0x0) {
    this_09 = (CurrencyPluralInfoAffixProvider *)&localPAPP;
    icu_63::number::impl::PropertiesAffixPatternProvider::setTo
              ((PropertiesAffixPatternProvider *)this_09,properties,status);
  }
  else {
    icu_63::number::impl::CurrencyPluralInfoAffixProvider::setTo(this_09,cpi,properties,status);
  }
  if (U_ZERO_ERROR < *status) {
    this_07 = (NumberParserImpl *)0x0;
    goto LAB_0026841f;
  }
  icu_63::number::impl::resolveCurrency(&currency,properties,&locale,status);
  CurrencyUnit::CurrencyUnit(&local_ed8,&currency);
  icu_63::number::impl::CurrencySymbols::CurrencySymbols
            (&currencySymbols,&local_ed8,&locale,symbols,status);
  CurrencyUnit::~CurrencyUnit(&local_ed8);
  bVar4 = (properties->parseMode).fValue == PARSE_MODE_STRICT | (properties->parseMode).fNull;
  local_f18 = icu_63::number::impl::Grouper::forProperties(properties);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    bVar1 = properties->parseCaseSensitive;
    bVar2 = properties->parseIntegerOnly;
    bVar3 = properties->signAlwaysShown;
    iVar6 = icu_63::number::impl::Grouper::getPrimary(&local_f18);
    uVar14 = bVar1 ^ 1;
    uVar13 = uVar14 + 0x10;
    if (bVar2 == false) {
      uVar13 = uVar14;
    }
    uVar14 = uVar13 + 0x400;
    if (bVar3 == false) {
      uVar14 = uVar13;
    }
    uVar13 = 0x80;
    if (bVar4 != 0) {
      uVar13 = 0x30c;
    }
    uVar13 = uVar13 | uVar14;
    size = (size_t)uVar13;
    uVar14 = uVar13 | 0x20;
    if (0 < iVar6) {
      uVar14 = uVar13;
    }
    if (parseCurrency) {
LAB_00267e31:
      uVar14 = uVar14 | 2;
    }
    else {
      iVar7 = (*(this_09->super_AffixPatternProvider)._vptr_AffixPatternProvider[5])(this_09);
      if ((char)iVar7 != '\0') goto LAB_00267e31;
    }
    uVar13 = uVar14 | 0x2000;
    if (parseCurrency) {
      uVar13 = uVar14;
    }
    this_07 = (NumberParserImpl *)UMemory::operator_new((UMemory *)0x1040,size);
    if (this_07 != (NumberParserImpl *)0x0) {
      NumberParserImpl(this_07,uVar13);
    }
    IgnorablesMatcher::IgnorablesMatcher
              ((IgnorablesMatcher *)local_d48,(uint)bVar4 + DEFAULT_IGNORABLES);
    this = &this_07->fLocalMatchers;
    SymbolMatcher::operator=((SymbolMatcher *)this,(SymbolMatcher *)local_d48);
    SymbolMatcher::~SymbolMatcher((SymbolMatcher *)local_d48);
    affixSetupData.currencySymbols = &currencySymbols;
    affixSetupData.locale = &locale;
    affixSetupData.dfs = symbols;
    affixSetupData.ignorables = &this->ignorables;
    affixSetupData.parseFlags = uVar13;
    AffixTokenMatcherWarehouse::AffixTokenMatcherWarehouse
              ((AffixTokenMatcherWarehouse *)local_d48,&affixSetupData);
    this_00 = &(this_07->fLocalMatchers).affixTokenMatcherWarehouse;
    AffixTokenMatcherWarehouse::operator=(this_00,(AffixTokenMatcherWarehouse *)local_d48);
    AffixTokenMatcherWarehouse::~AffixTokenMatcherWarehouse((AffixTokenMatcherWarehouse *)local_d48)
    ;
    AffixMatcherWarehouse::AffixMatcherWarehouse((AffixMatcherWarehouse *)local_d48,this_00);
    this_01 = &(this_07->fLocalMatchers).affixMatcherWarehouse;
    AffixMatcherWarehouse::operator=(this_01,(AffixMatcherWarehouse *)local_d48);
    AffixMatcherWarehouse::~AffixMatcherWarehouse((AffixMatcherWarehouse *)local_d48);
    AffixMatcherWarehouse::createAffixMatchers
              (this_01,&this_09->super_AffixPatternProvider,(MutableMatcherCollection *)this_07,
               &this->ignorables,uVar13,status);
    if (parseCurrency) {
LAB_00267f6a:
      CombinedCurrencyMatcher::CombinedCurrencyMatcher
                ((CombinedCurrencyMatcher *)local_d48,&currencySymbols,symbols,uVar13,status);
      pCVar8 = CombinedCurrencyMatcher::operator=
                         (&(this_07->fLocalMatchers).currency,(CombinedCurrencyMatcher *)local_d48);
      (*(this_07->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])(this_07,pCVar8)
      ;
      CombinedCurrencyMatcher::~CombinedCurrencyMatcher((CombinedCurrencyMatcher *)local_d48);
    }
    else {
      iVar7 = (*(this_09->super_AffixPatternProvider)._vptr_AffixPatternProvider[5])(this_09);
      if ((char)iVar7 != '\0') goto LAB_00267f6a;
    }
    if (bVar4 == 0) {
      iVar7 = (*(this_09->super_AffixPatternProvider)._vptr_AffixPatternProvider[9])
                        (this_09,0xfffffffffffffffd,status);
      if ((char)iVar7 != '\0') {
        PercentMatcher::PercentMatcher((PercentMatcher *)local_d48,symbols);
        this_02 = &(this_07->fLocalMatchers).percent;
        SymbolMatcher::operator=(&this_02->super_SymbolMatcher,(SymbolMatcher *)local_d48);
        (*(this_07->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])
                  (this_07,this_02);
        SymbolMatcher::~SymbolMatcher((SymbolMatcher *)local_d48);
      }
      iVar7 = (*(this_09->super_AffixPatternProvider)._vptr_AffixPatternProvider[9])
                        (this_09,0xfffffffffffffffc,status);
      if ((char)iVar7 != '\0') {
        PermilleMatcher::PermilleMatcher((PermilleMatcher *)local_d48,symbols);
        this_03 = &(this_07->fLocalMatchers).permille;
        SymbolMatcher::operator=(&this_03->super_SymbolMatcher,(SymbolMatcher *)local_d48);
        (*(this_07->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])
                  (this_07,this_03);
        SymbolMatcher::~SymbolMatcher((SymbolMatcher *)local_d48);
      }
      PlusSignMatcher::PlusSignMatcher((PlusSignMatcher *)local_d48,symbols,false);
      pPVar9 = PlusSignMatcher::operator=
                         (&(this_07->fLocalMatchers).plusSign,(PlusSignMatcher *)local_d48);
      (*(this_07->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])(this_07,pPVar9)
      ;
      SymbolMatcher::~SymbolMatcher((SymbolMatcher *)local_d48);
      MinusSignMatcher::MinusSignMatcher((MinusSignMatcher *)local_d48,symbols,false);
      pMVar10 = MinusSignMatcher::operator=
                          (&(this_07->fLocalMatchers).minusSign,(MinusSignMatcher *)local_d48);
      (*(this_07->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])
                (this_07,pMVar10);
      SymbolMatcher::~SymbolMatcher((SymbolMatcher *)local_d48);
    }
    NanMatcher::NanMatcher((NanMatcher *)local_d48,symbols);
    this_04 = &(this_07->fLocalMatchers).nan;
    SymbolMatcher::operator=(&this_04->super_SymbolMatcher,(SymbolMatcher *)local_d48);
    (*(this_07->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])(this_07,this_04);
    SymbolMatcher::~SymbolMatcher((SymbolMatcher *)local_d48);
    InfinityMatcher::InfinityMatcher((InfinityMatcher *)local_d48,symbols);
    this_05 = &(this_07->fLocalMatchers).infinity;
    SymbolMatcher::operator=(&this_05->super_SymbolMatcher,(SymbolMatcher *)local_d48);
    (*(this_07->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])(this_07,this_05);
    SymbolMatcher::~SymbolMatcher((SymbolMatcher *)local_d48);
    UnicodeString::UnicodeString(&padString,&properties->padString);
    if ((padString.fUnion.fStackFields.fLengthAndFlags._0_1_ & 1) == 0) {
      this_08 = SymbolMatcher::getSet((SymbolMatcher *)this);
      UVar5 = UnicodeSet::contains(this_08,&padString);
      if (UVar5 == '\0') {
        PaddingMatcher::PaddingMatcher((PaddingMatcher *)local_d48,&padString);
        this_06 = &(this_07->fLocalMatchers).padding;
        SymbolMatcher::operator=(&this_06->super_SymbolMatcher,(SymbolMatcher *)local_d48);
        (*(this_07->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])
                  (this_07,this_06);
        SymbolMatcher::~SymbolMatcher((SymbolMatcher *)local_d48);
      }
    }
    (*(this_07->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])(this_07,this);
    DecimalMatcher::DecimalMatcher((DecimalMatcher *)local_d48,symbols,&local_f18,uVar13);
    pDVar11 = DecimalMatcher::operator=
                        (&(this_07->fLocalMatchers).decimal,(DecimalMatcher *)local_d48);
    (*(this_07->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])(this_07,pDVar11);
    DecimalMatcher::~DecimalMatcher((DecimalMatcher *)local_d48);
    if ((properties->parseNoExponent != true) || (0 < properties->minimumExponentDigits)) {
      ScientificMatcher::ScientificMatcher((ScientificMatcher *)local_d48,symbols,&local_f18);
      pSVar12 = ScientificMatcher::operator=
                          (&(this_07->fLocalMatchers).scientific,(ScientificMatcher *)local_d48);
      (*(this_07->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])
                (this_07,pSVar12);
      ScientificMatcher::~ScientificMatcher((ScientificMatcher *)local_d48);
    }
    (*(this_07->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])
              (this_07,&(this_07->fLocalValidators).number);
    if (bVar4 != 0) {
      (*(this_07->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])
                (this_07,&this_07->fLocalValidators);
    }
    if (parseCurrency) {
      (*(this_07->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])
                (this_07,&(this_07->fLocalValidators).currency);
    }
    if (properties->decimalPatternMatchRequired == true) {
      RequireDecimalSeparatorValidator::RequireDecimalSeparatorValidator
                ((RequireDecimalSeparatorValidator *)local_d48,
                 (bool)(properties->maximumFractionDigits != 0 |
                       properties->decimalSeparatorAlwaysShown));
      (this_07->fLocalValidators).decimalSeparator.fPatternHasDecimalSeparator =
           local_d40[0].fMagnitude._0_1_;
      (*(this_07->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])
                (this_07,&(this_07->fLocalValidators).decimalSeparator);
    }
    iVar7 = properties->multiplier;
    power = properties->multiplierScale + properties->magnitudeMultiplier;
    if (iVar7 == 1 || power == 0) {
      if (power == 0) {
        if (iVar7 == 1) {
          icu_63::number::Scale::none();
        }
        else {
          icu_63::number::Scale::byDouble(&multiplier,(double)iVar7);
        }
      }
      else {
        icu_63::number::Scale::powerOfTen(power);
      }
    }
    else {
      icu_63::number::Scale::byDoubleAndPowerOfTen(&multiplier,(double)iVar7,power);
    }
    if ((multiplier.fMagnitude != 0) || (multiplier.fArbitrary != (DecNum *)0x0)) {
      icu_63::number::Scale::Scale(&local_ef0,&multiplier);
      MultiplierParseHandler::MultiplierParseHandler((MultiplierParseHandler *)local_d48,&local_ef0)
      ;
      icu_63::number::Scale::operator=
                (&(this_07->fLocalValidators).multiplier.fMultiplier,local_d40);
      (*(this_07->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])
                (this_07,&(this_07->fLocalValidators).multiplier);
      MultiplierParseHandler::~MultiplierParseHandler((MultiplierParseHandler *)local_d48);
      icu_63::number::Scale::~Scale(&local_ef0);
    }
    this_07->fFrozen = true;
    icu_63::number::Scale::~Scale(&multiplier);
    UnicodeString::~UnicodeString(&padString);
  }
  else {
    this_07 = (NumberParserImpl *)0x0;
  }
  icu_63::number::impl::CurrencySymbols::~CurrencySymbols(&currencySymbols);
  CurrencyUnit::~CurrencyUnit(&currency);
LAB_0026841f:
  icu_63::number::impl::CurrencyPluralInfoAffixProvider::~CurrencyPluralInfoAffixProvider
            (&localCPIAP);
  icu_63::number::impl::PropertiesAffixPatternProvider::~PropertiesAffixPatternProvider(&localPAPP);
  Locale::~Locale(&locale);
  return this_07;
}

Assistant:

NumberParserImpl*
NumberParserImpl::createParserFromProperties(const number::impl::DecimalFormatProperties& properties,
                                             const DecimalFormatSymbols& symbols, bool parseCurrency,
                                             UErrorCode& status) {
    Locale locale = symbols.getLocale();
    PropertiesAffixPatternProvider localPAPP;
    CurrencyPluralInfoAffixProvider localCPIAP;
    AffixPatternProvider* affixProvider;
    if (properties.currencyPluralInfo.fPtr.isNull()) {
        localPAPP.setTo(properties, status);
        affixProvider = &localPAPP;
    } else {
        localCPIAP.setTo(*properties.currencyPluralInfo.fPtr, properties, status);
        affixProvider = &localCPIAP;
    }
    if (affixProvider == nullptr || U_FAILURE(status)) { return nullptr; }
    CurrencyUnit currency = resolveCurrency(properties, locale, status);
    CurrencySymbols currencySymbols(currency, locale, symbols, status);
    bool isStrict = properties.parseMode.getOrDefault(PARSE_MODE_STRICT) == PARSE_MODE_STRICT;
    Grouper grouper = Grouper::forProperties(properties);
    int parseFlags = 0;
    if (affixProvider == nullptr || U_FAILURE(status)) { return nullptr; }
    if (!properties.parseCaseSensitive) {
        parseFlags |= PARSE_FLAG_IGNORE_CASE;
    }
    if (properties.parseIntegerOnly) {
        parseFlags |= PARSE_FLAG_INTEGER_ONLY;
    }
    if (properties.signAlwaysShown) {
        parseFlags |= PARSE_FLAG_PLUS_SIGN_ALLOWED;
    }
    if (isStrict) {
        parseFlags |= PARSE_FLAG_STRICT_GROUPING_SIZE;
        parseFlags |= PARSE_FLAG_STRICT_SEPARATORS;
        parseFlags |= PARSE_FLAG_USE_FULL_AFFIXES;
        parseFlags |= PARSE_FLAG_EXACT_AFFIX;
    } else {
        parseFlags |= PARSE_FLAG_INCLUDE_UNPAIRED_AFFIXES;
    }
    if (grouper.getPrimary() <= 0) {
        parseFlags |= PARSE_FLAG_GROUPING_DISABLED;
    }
    if (parseCurrency || affixProvider->hasCurrencySign()) {
        parseFlags |= PARSE_FLAG_MONETARY_SEPARATORS;
    }
    if (!parseCurrency) {
        parseFlags |= PARSE_FLAG_NO_FOREIGN_CURRENCY;
    }

    LocalPointer<NumberParserImpl> parser(new NumberParserImpl(parseFlags));

    parser->fLocalMatchers.ignorables = {
            isStrict ? unisets::STRICT_IGNORABLES : unisets::DEFAULT_IGNORABLES};
    IgnorablesMatcher& ignorables = parser->fLocalMatchers.ignorables;

    //////////////////////
    /// AFFIX MATCHERS ///
    //////////////////////

    // The following statements set up the affix matchers.
    AffixTokenMatcherSetupData affixSetupData = {
            currencySymbols, symbols, ignorables, locale, parseFlags};
    parser->fLocalMatchers.affixTokenMatcherWarehouse = {&affixSetupData};
    parser->fLocalMatchers.affixMatcherWarehouse = {&parser->fLocalMatchers.affixTokenMatcherWarehouse};
    parser->fLocalMatchers.affixMatcherWarehouse.createAffixMatchers(
            *affixProvider, *parser, ignorables, parseFlags, status);

    ////////////////////////
    /// CURRENCY MATCHER ///
    ////////////////////////

    if (parseCurrency || affixProvider->hasCurrencySign()) {
        parser->addMatcher(parser->fLocalMatchers.currency = {currencySymbols, symbols, parseFlags, status});
    }

    ///////////////
    /// PERCENT ///
    ///////////////

    // ICU-TC meeting, April 11, 2018: accept percent/permille only if it is in the pattern,
    // and to maintain regressive behavior, divide by 100 even if no percent sign is present.
    if (!isStrict && affixProvider->containsSymbolType(AffixPatternType::TYPE_PERCENT, status)) {
        parser->addMatcher(parser->fLocalMatchers.percent = {symbols});
    }
    if (!isStrict && affixProvider->containsSymbolType(AffixPatternType::TYPE_PERMILLE, status)) {
        parser->addMatcher(parser->fLocalMatchers.permille = {symbols});
    }

    ///////////////////////////////
    /// OTHER STANDARD MATCHERS ///
    ///////////////////////////////

    if (!isStrict) {
        parser->addMatcher(parser->fLocalMatchers.plusSign = {symbols, false});
        parser->addMatcher(parser->fLocalMatchers.minusSign = {symbols, false});
    }
    parser->addMatcher(parser->fLocalMatchers.nan = {symbols});
    parser->addMatcher(parser->fLocalMatchers.infinity = {symbols});
    UnicodeString padString = properties.padString;
    if (!padString.isBogus() && !ignorables.getSet()->contains(padString)) {
        parser->addMatcher(parser->fLocalMatchers.padding = {padString});
    }
    parser->addMatcher(parser->fLocalMatchers.ignorables);
    parser->addMatcher(parser->fLocalMatchers.decimal = {symbols, grouper, parseFlags});
    // NOTE: parseNoExponent doesn't disable scientific parsing if we have a scientific formatter
    if (!properties.parseNoExponent || properties.minimumExponentDigits > 0) {
        parser->addMatcher(parser->fLocalMatchers.scientific = {symbols, grouper});
    }

    //////////////////
    /// VALIDATORS ///
    //////////////////

    parser->addMatcher(parser->fLocalValidators.number = {});
    if (isStrict) {
        parser->addMatcher(parser->fLocalValidators.affix = {});
    }
    if (parseCurrency) {
        parser->addMatcher(parser->fLocalValidators.currency = {});
    }
    if (properties.decimalPatternMatchRequired) {
        bool patternHasDecimalSeparator =
                properties.decimalSeparatorAlwaysShown || properties.maximumFractionDigits != 0;
        parser->addMatcher(parser->fLocalValidators.decimalSeparator = {patternHasDecimalSeparator});
    }
    // The multiplier takes care of scaling percentages.
    Scale multiplier = scaleFromProperties(properties);
    if (multiplier.isValid()) {
        parser->addMatcher(parser->fLocalValidators.multiplier = {multiplier});
    }

    parser->freeze();
    return parser.orphan();
}